

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O0

json_t * parse_value(lex_t *lex,size_t flags,json_error_t *error)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  uchar *value_00;
  void *pvVar4;
  ulong local_88;
  size_t num_read;
  char *pos;
  uchar *mem;
  uchar *temp;
  size_t len;
  char *value;
  json_t *json;
  json_error_t *error_local;
  size_t flags_local;
  lex_t *lex_local;
  
  lex->depth = lex->depth + 1;
  if (lex->depth < 0x801) {
    iVar1 = lex->token;
    if (iVar1 == -1) {
      error_set(error,lex,"invalid token");
      lex_local = (lex_t *)0x0;
    }
    else {
      if (iVar1 == 0x5b) {
        value = (char *)parse_array(lex,flags,error);
      }
      else if (iVar1 == 0x7b) {
        value = (char *)parse_object(lex,flags,error);
      }
      else if (iVar1 == 0x100) {
        pcVar3 = (lex->value).string.val;
        uVar2 = (lex->value).string.len;
        if ((uVar2 < 7) || (iVar1 = memcmp(pcVar3,"::MEM::",7), iVar1 != 0)) {
          if (((flags & 0x10) == 0) && (pvVar4 = memchr(pcVar3,0,uVar2), pvVar4 != (void *)0x0)) {
            error_set(error,lex,"\\u0000 is not allowed without JSON_ALLOW_NUL");
            return (json_t *)0x0;
          }
          value = (char *)jsonp_stringn_nocheck_own(pcVar3,uVar2);
          if ((json_t *)value != (json_t *)0x0) {
            (lex->value).string.val = (char *)0x0;
            (lex->value).string.len = 0;
          }
        }
        else {
          uVar2 = uVar2 - 7;
          pcVar3 = pcVar3 + 7;
          value_00 = (uchar *)malloc(uVar2 >> 1);
          num_read = (size_t)pcVar3;
          mem = value_00;
          if (value_00 == (uchar *)0x0) {
            return (json_t *)0x0;
          }
          for (; num_read < pcVar3 + uVar2; num_read = local_88 + num_read) {
            if ((char *)(num_read + 0x20) < pcVar3 + uVar2) {
              __isoc99_sscanf(num_read,
                              "%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx"
                              ,mem,mem + 1,mem + 2,mem + 3,mem + 4,mem + 5,mem + 6,mem + 7,mem + 8,
                              mem + 9,mem + 10,mem + 0xb,mem + 0xc,mem + 0xd,mem + 0xe,mem + 0xf,
                              mem + 0x10,mem + 0x11,mem + 0x12,mem + 0x13,mem + 0x14,mem + 0x15,
                              mem + 0x16,mem + 0x17,mem + 0x18,mem + 0x19,mem + 0x1a,mem + 0x1b,
                              mem + 0x1c,mem + 0x1d,mem + 0x1e,mem + 0x1f);
              local_88 = 0x40;
            }
            else {
              __isoc99_sscanf(num_read,"%02hhx",mem);
              local_88 = 2;
            }
            mem = mem + (local_88 >> 1);
          }
          value = (char *)json_mem_own((char *)value_00,uVar2 >> 1);
        }
      }
      else if (iVar1 == 0x101) {
        value = (char *)json_integer((lex->value).integer);
      }
      else if (iVar1 == 0x102) {
        value = (char *)json_real((lex->value).real);
      }
      else if (iVar1 == 0x103) {
        value = (char *)json_true();
      }
      else if (iVar1 == 0x104) {
        value = (char *)json_false();
      }
      else {
        if (iVar1 != 0x105) {
          error_set(error,lex,"unexpected token");
          return (json_t *)0x0;
        }
        value = (char *)json_null();
      }
      if (value == (char *)0x0) {
        lex_local = (lex_t *)0x0;
      }
      else {
        lex->depth = lex->depth - 1;
        lex_local = (lex_t *)value;
      }
    }
  }
  else {
    error_set(error,lex,"maximum parsing depth reached");
    lex_local = (lex_t *)0x0;
  }
  return (json_t *)lex_local;
}

Assistant:

static json_t *parse_value(lex_t *lex, size_t flags, json_error_t *error)
{
	json_t *json;

	lex->depth++;
	if (lex->depth > JSON_PARSER_MAX_DEPTH) {
		error_set(error, lex, "maximum parsing depth reached");
		return NULL;
	}

	switch (lex->token) {
	case TOKEN_STRING: {
		const char *value = lex->value.string.val;
		size_t len = lex->value.string.len;
		unsigned char * temp, *mem;
		const char *pos;

		if (len >= MEM_TOKEN_LEN && !memcmp(value, MEM_TOKEN, MEM_TOKEN_LEN))
		{
			len = len - MEM_TOKEN_LEN;
			value = value + MEM_TOKEN_LEN;
			mem = temp = malloc(len / 2);
			if (!temp)
				return NULL;

			size_t num_read;
			for (pos = value; pos < value + len; pos += num_read, temp += num_read / 2)
			{
				if (pos + 0x20 < value + len)
				{
					sscanf(pos, 
						"%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx"
						"%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx%02hhx",
						temp, temp + 1, temp + 2, temp + 3, temp + 4, temp + 5, temp + 6, temp + 7,
						temp + 8, temp + 9, temp + 10, temp + 11, temp + 12, temp + 13, temp + 14, temp + 15,
						temp + 16, temp + 17, temp + 18, temp + 19, temp + 20, temp + 21, temp + 22, temp + 23,
						temp + 24, temp + 25, temp + 26, temp + 27, temp + 28, temp + 29, temp + 30, temp + 31);
					num_read = 0x40;
				}
				else
				{
					sscanf(pos, "%02hhx", temp);
					num_read = 2;
				}
			}
			json = json_mem_own(mem, len / 2);
		}
		else
		{

			if (!(flags & JSON_ALLOW_NUL)) {
				if (memchr(value, '\0', len)) {
					error_set(error, lex, "\\u0000 is not allowed without JSON_ALLOW_NUL");
					return NULL;
				}
			}

			json = jsonp_stringn_nocheck_own(value, len);
			if (json) {
				lex->value.string.val = NULL;
				lex->value.string.len = 0;
			}
		}
		break;
	}

	case TOKEN_INTEGER: {
		json = json_integer(lex->value.integer);
		break;
	}

	case TOKEN_REAL: {
		json = json_real(lex->value.real);
		break;
	}

	case TOKEN_TRUE:
		json = json_true();
		break;

	case TOKEN_FALSE:
		json = json_false();
		break;

	case TOKEN_NULL:
		json = json_null();
		break;

	case '{':
		json = parse_object(lex, flags, error);
		break;

	case '[':
		json = parse_array(lex, flags, error);
		break;

	case TOKEN_INVALID:
		error_set(error, lex, "invalid token");
		return NULL;

	default:
		error_set(error, lex, "unexpected token");
		return NULL;
	}

	if (!json)
		return NULL;

	lex->depth--;
	return json;
}